

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::FluxRegister::CrseAdd
          (FluxRegister *this,MultiFab *mflx,MultiFab *area,int dir,int srccomp,int destcomp,
          int numcomp,Real mult,Geometry *geom)

{
  int iVar1;
  bool bVar2;
  BoxArray *bxs;
  MultiFab *this_00;
  int in_ECX;
  FabArrayBase *in_RSI;
  Geometry *in_RDI;
  int in_R8D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int in_stack_00000008;
  Orientation face;
  int pass;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> afab;
  Array4<const_double> sfab;
  Array4<double> dfab;
  Box *bx;
  MFIter mfi;
  MultiFab mf;
  Orientation face_hi;
  Orientation face_lo;
  MFIter *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  Orientation *local_4f0;
  int *in_stack_fffffffffffffb18;
  MFIter *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  FabArrayBase *src;
  FabFactory<amrex::FArrayBox> *factory;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  Orientation local_488;
  int local_484;
  int local_480;
  int local_47c;
  int local_478;
  int local_474;
  undefined8 local_470;
  int local_468;
  undefined8 local_45c;
  int local_454;
  undefined8 local_450;
  int local_448;
  undefined8 local_440;
  int local_438;
  long local_430;
  long local_428;
  long local_420;
  int local_410;
  int local_40c;
  int local_408;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  int local_390;
  int local_38c;
  int local_388;
  int local_36c [7];
  int *local_350;
  MFIter local_348;
  FabFactory<amrex::FArrayBox> local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  Orientation local_130;
  Orientation local_12c;
  double local_128;
  int local_118;
  int local_114;
  FabArrayBase *local_108;
  undefined8 local_f8;
  int local_f0;
  int *local_e8;
  int local_dc;
  int iStack_d8;
  int local_d4;
  undefined8 local_d0;
  int local_c8;
  int *local_c0;
  int local_b4;
  int iStack_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_128 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_118 = in_R8D;
  local_114 = in_ECX;
  local_108 = in_RSI;
  Orientation::Orientation(&local_12c,in_ECX,low);
  Orientation::Orientation(&local_130,local_114,high);
  bxs = FabArrayBase::boxArray(local_108);
  this_00 = (MultiFab *)FabArrayBase::DistributionMap(local_108);
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8._vptr_FabFactory = (_func_int **)0x0;
  uStack_2d0 = 0;
  local_2b8 = 0;
  factory = &local_2d8;
  MFInfo::MFInfo((MFInfo *)0x105ff4e);
  FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x105ff5b);
  MultiFab::MultiFab(this_00,bxs,(DistributionMapping *)in_RDI,
                     (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(int)in_stack_fffffffffffffb28,
                     (MFInfo *)in_stack_fffffffffffffb20,factory);
  MFInfo::~MFInfo((MFInfo *)0x105ff98);
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)in_RDI,local_108,SUB81((ulong)in_stack_fffffffffffffb20 >> 0x38,0));
  src = local_108;
  while (bVar2 = MFIter::isValid(&local_348), bVar2) {
    in_stack_fffffffffffffb18 = local_36c;
    in_stack_fffffffffffffb20 = &local_348;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    local_350 = in_stack_fffffffffffffb18;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
               in_stack_fffffffffffffb00);
    local_e8 = local_350;
    local_8 = local_350;
    local_c = 0;
    local_dc = *local_350;
    local_18 = local_350;
    local_1c = 1;
    iStack_d8 = local_350[1];
    local_450 = *(undefined8 *)local_350;
    local_28 = local_350;
    local_2c = 2;
    local_448 = local_350[2];
    local_c0 = local_350;
    local_38 = local_350 + 3;
    local_3c = 0;
    local_b4 = *local_38;
    local_48 = local_350 + 3;
    local_4c = 1;
    iStack_b0 = local_350[4];
    local_470 = *(undefined8 *)local_38;
    local_58 = local_350 + 3;
    local_5c = 2;
    local_468 = local_350[5];
    for (local_474 = 0; iVar1 = local_448, local_474 < in_stack_00000008; local_474 = local_474 + 1)
    {
      while (local_478 = iVar1, iVar1 = iStack_d8, local_478 <= local_468) {
        while (local_47c = iVar1, iVar1 = local_dc, local_47c <= iStack_b0) {
          while (local_480 = iVar1, local_480 <= local_b4) {
            local_9c = local_480;
            local_a0 = local_47c;
            local_a4 = local_478;
            local_a8 = local_474 + local_118;
            local_98 = &local_3f0;
            local_84 = local_480;
            local_88 = local_47c;
            local_8c = local_478;
            local_80 = &local_430;
            local_6c = local_480;
            local_70 = local_47c;
            local_74 = local_478;
            local_78 = local_474;
            local_68 = &local_3b0;
            *(double *)
             (local_3b0 +
             ((long)(local_480 - local_390) + (local_47c - local_38c) * local_3a8 +
              (local_478 - local_388) * local_3a0 + local_474 * local_398) * 8) =
                 *(double *)
                  (local_3f0 +
                  ((long)(local_480 - local_3d0) + (local_47c - local_3cc) * local_3e8 +
                   (local_478 - local_3c8) * local_3e0 + local_a8 * local_3d8) * 8) * local_128 *
                 *(double *)
                  (local_430 +
                  ((long)(local_480 - local_410) + (local_47c - local_40c) * local_428 +
                  (local_478 - local_408) * local_420) * 8);
            iVar1 = local_480 + 1;
          }
          iVar1 = local_47c + 1;
        }
        iVar1 = local_478 + 1;
      }
    }
    local_45c = local_470;
    local_454 = local_468;
    local_440 = local_450;
    local_438 = local_448;
    local_f8 = local_450;
    local_f0 = local_448;
    local_d4 = local_448;
    local_d0 = local_470;
    local_c8 = local_468;
    local_ac = local_468;
    MFIter::operator++(&local_348);
  }
  MFIter::~MFIter(in_stack_fffffffffffffb00);
  for (local_484 = 0; local_484 < 2; local_484 = local_484 + 1) {
    if (local_484 == 0) {
      local_4f0 = &local_12c;
    }
    else {
      local_4f0 = &local_130;
    }
    local_488.val = local_4f0->val;
    Orientation::operator_cast_to_int(&local_488);
    Geometry::periodicity(in_RDI);
    FabSet::plusFrom((FabSet *)in_RDI,(MultiFab *)src,
                     (int)((ulong)in_stack_fffffffffffffb20 >> 0x20),(int)in_stack_fffffffffffffb20,
                     (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
                     (Periodicity *)this_00);
  }
  MultiFab::~MultiFab((MultiFab *)0x1060698);
  return;
}

Assistant:

void
FluxRegister::CrseAdd (const MultiFab& mflx,
                       const MultiFab& area,
                       int             dir,
                       int             srccomp,
                       int             destcomp,
                       int             numcomp,
                       Real            mult,
                       const Geometry& geom)
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= mflx.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    const Orientation face_lo(dir,Orientation::low);
    const Orientation face_hi(dir,Orientation::high);

    MultiFab mf(mflx.boxArray(),mflx.DistributionMap(),numcomp,0,
                MFInfo(), mflx.Factory());

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mflx.isFusingCandidate()) {
        auto const& dma = mf.arrays();
        auto const& sma = mflx.const_arrays();
        auto const& ama = area.const_arrays();
        ParallelFor(mf, IntVect(0), numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dma[box_no](i,j,k,n) = sma[box_no](i,j,k,n+srccomp)*mult*ama[box_no](i,j,k);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mflx,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto       dfab =   mf.array(mfi);
            auto const sfab = mflx.const_array(mfi);
            auto const afab = area.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, numcomp, i, j, k, n,
            {
                dfab(i,j,k,n) = sfab(i,j,k,n+srccomp)*mult*afab(i,j,k);
            });
        }
    }

    for (int pass = 0; pass < 2; pass++)
    {
        const Orientation face = ((pass == 0) ? face_lo : face_hi);
        bndry[face].plusFrom(mf,0,0,destcomp,numcomp,geom.periodicity());
    }
}